

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O3

void __thiscall
BoundaryElement::matrix_vector
          (BoundaryElement *this,double alpha,double *potential_old,double beta,
          double *potential_new)

{
  double dVar1;
  Timers_BoundaryElement *pTVar2;
  pointer pvVar3;
  size_t *psVar4;
  size_t sVar5;
  pointer pdVar6;
  pointer pdVar7;
  rep rVar8;
  void *__dest;
  InteractionList *pIVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  double *potential;
  ulong uVar13;
  double *node_idx;
  size_t __size;
  size_t *psVar14;
  array<unsigned_long,_2UL> aVar15;
  array<unsigned_long,_2UL> source_node_element_idxs;
  
  pTVar2 = this->timers_;
  rVar8 = std::chrono::_V2::steady_clock::now();
  (pTVar2->matrix_vector).start_time_.__d.__r = rVar8;
  dVar1 = this->params_->phys_eps_;
  __size = (long)(this->potential_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->potential_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  __dest = malloc(__size);
  memcpy(__dest,potential_new,__size);
  memset(potential_new,0,__size);
  clear_cluster_charges(this);
  clear_cluster_potentials(this);
  Elements::compute_charges(this->elements_,potential_old);
  upward_pass(this);
  if (this->tree_->num_nodes_ != 0) {
    node_idx = (double *)0x0;
    do {
      pIVar9 = this->interaction_list_;
      pvVar3 = (pIVar9->particle_particle_).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar14 = pvVar3[(long)node_idx].
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      psVar4 = *(pointer *)
                ((long)&pvVar3[(long)node_idx].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (psVar14 != psVar4) {
        do {
          sVar5 = *psVar14;
          aVar15 = Tree::node_particle_idxs(this->tree_,(size_t)node_idx);
          source_node_element_idxs = Tree::node_particle_idxs(this->tree_,sVar5);
          particle_particle_interact
                    (this,potential_new,potential_old,aVar15,source_node_element_idxs);
          psVar14 = psVar14 + 1;
        } while (psVar14 != psVar4);
        pIVar9 = this->interaction_list_;
      }
      pvVar3 = (pIVar9->particle_cluster_).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar14 = pvVar3[(long)node_idx].
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      psVar4 = *(pointer *)
                ((long)&pvVar3[(long)node_idx].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (psVar14 != psVar4) {
        do {
          sVar5 = *psVar14;
          aVar15 = Tree::node_particle_idxs(this->tree_,(size_t)node_idx);
          particle_cluster_interact(this,potential_new,aVar15,sVar5);
          psVar14 = psVar14 + 1;
        } while (psVar14 != psVar4);
        pIVar9 = this->interaction_list_;
      }
      pvVar3 = (pIVar9->cluster_particle_).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar14 = pvVar3[(long)node_idx].
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      psVar4 = *(pointer *)
                ((long)&pvVar3[(long)node_idx].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data + 8);
      potential = node_idx;
      if (psVar14 != psVar4) {
        do {
          potential = (double *)*psVar14;
          aVar15 = Tree::node_particle_idxs(this->tree_,(size_t)potential);
          cluster_particle_interact(this,potential,(size_t)node_idx,aVar15);
          psVar14 = psVar14 + 1;
        } while (psVar14 != psVar4);
        pIVar9 = this->interaction_list_;
      }
      pvVar3 = (pIVar9->cluster_cluster_).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar4 = *(pointer *)
                ((long)&pvVar3[(long)node_idx].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (psVar14 = pvVar3[(long)node_idx].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; psVar14 != psVar4; psVar14 = psVar14 + 1) {
        cluster_cluster_interact(this,potential,(size_t)node_idx,*psVar14);
      }
      node_idx = (double *)((long)node_idx + 1);
    } while (node_idx < (double *)this->tree_->num_nodes_);
  }
  downward_pass(this,potential_new);
  pdVar6 = (this->potential_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->potential_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar10 = (long)pdVar7 - (long)pdVar6 >> 3;
  uVar12 = uVar10 >> 1;
  if (1 < uVar10) {
    uVar13 = 0;
    do {
      potential_new[uVar13] =
           *(double *)((long)__dest + uVar13 * 8) * beta +
           (potential_old[uVar13] * (dVar1 + 1.0) * 0.5 - potential_new[uVar13]) * alpha;
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  if (pdVar7 != pdVar6) {
    do {
      potential_new[uVar12] =
           *(double *)((long)__dest + uVar12 * 8) * beta +
           (potential_old[uVar12] * (1.0 / dVar1 + 1.0) * 0.5 - potential_new[uVar12]) * alpha;
      uVar12 = uVar12 + 1;
    } while (uVar12 < uVar10);
  }
  free(__dest);
  pTVar2 = this->timers_;
  lVar11 = std::chrono::_V2::steady_clock::now();
  (pTVar2->matrix_vector).end_time_.__d.__r = lVar11;
  (pTVar2->matrix_vector).elapsed_time_.__r =
       (double)(lVar11 - (pTVar2->matrix_vector).start_time_.__d.__r) / 1000000.0 +
       (pTVar2->matrix_vector).elapsed_time_.__r;
  return;
}

Assistant:

void BoundaryElement::matrix_vector(double alpha, const double* __restrict potential_old,
                                     double beta,       double* __restrict potential_new)
{
    timers_.matrix_vector.start();

    double potential_coeff_1 = 0.5 * (1. +      params_.phys_eps_);
    double potential_coeff_2 = 0.5 * (1. + 1. / params_.phys_eps_);
    
    std::size_t potential_num = potential_.size();
    auto* potential_temp = (double *)std::malloc(potential_num * sizeof(double));
    std::memcpy(potential_temp, potential_new, potential_num * sizeof(double));
    std::memset(potential_new, 0, potential_num * sizeof(double));

#ifdef OPENACC_ENABLED
    #pragma acc enter data copyin(potential_old[0:potential_num], \
                                  potential_new[0:potential_num])
#endif

    BoundaryElement::clear_cluster_charges();
    BoundaryElement::clear_cluster_potentials();

    elements_.compute_charges(potential_old);
    BoundaryElement::upward_pass();

#ifdef OPENMP_ENABLED
    #pragma omp parallel for
#endif
    for (std::size_t target_node_idx = 0; target_node_idx < tree_.num_nodes(); ++target_node_idx) {
        
        for (auto source_node_idx : interaction_list_.particle_particle(target_node_idx))
            BoundaryElement::particle_particle_interact(potential_new, potential_old,
                    tree_.node_particle_idxs(target_node_idx), tree_.node_particle_idxs(source_node_idx));
    
        for (auto source_node_idx : interaction_list_.particle_cluster(target_node_idx))
            BoundaryElement::particle_cluster_interact(potential_new, 
                    tree_.node_particle_idxs(target_node_idx), source_node_idx);
        
        for (auto source_node_idx : interaction_list_.cluster_particle(target_node_idx))
            BoundaryElement::cluster_particle_interact(potential_new, 
                    target_node_idx, tree_.node_particle_idxs(source_node_idx));
        
        for (auto source_node_idx : interaction_list_.cluster_cluster(target_node_idx))
            BoundaryElement::cluster_cluster_interact(potential_new, target_node_idx, source_node_idx);
    }

#ifdef OPENACC_ENABLED
    #pragma acc wait
#endif
    
#ifdef OPENACC_ENABLED
    #pragma acc wait
#endif
    
    BoundaryElement::downward_pass(potential_new);

#ifdef OPENACC_ENABLED
    #pragma acc exit data copyout(potential_old[0:potential_num], \
                                  potential_new[0:potential_num])
#endif
    
    for (std::size_t i = 0; i < potential_.size() / 2; ++i)
        potential_new[i] = beta * potential_temp[i]
                + alpha * (potential_coeff_1 * potential_old[i] - potential_new[i]);
                                             
    for (std::size_t i = potential_.size() / 2; i < potential_.size(); ++i)
        potential_new[i] =  beta * potential_temp[i]
                + alpha * (potential_coeff_2 * potential_old[i] - potential_new[i]);
                
    std::free(potential_temp);

    timers_.matrix_vector.stop();
}